

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.h
# Opt level: O0

uint8_t slab_order(slab_cache *cache,size_t size)

{
  int iVar1;
  uint uVar2;
  size_t size_local;
  slab_cache *cache_local;
  
  if (cache->order0_size < size) {
    if (cache->arena->slab_size < size) {
      cache_local._7_1_ = cache->order_max + '\x01';
    }
    else {
      uVar2 = (int)size - 1;
      iVar1 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      cache_local._7_1_ = (' ' - ((byte)iVar1 ^ 0x1f)) - cache->order0_size_lb;
    }
  }
  else {
    cache_local._7_1_ = '\0';
  }
  return cache_local._7_1_;
}

Assistant:

static inline uint8_t
slab_order(struct slab_cache *cache, size_t size)
{
	if (size <= cache->order0_size)
		return 0;
	if (size > cache->arena->slab_size)
		return cache->order_max + 1;

	return (uint8_t) (CHAR_BIT * sizeof(unsigned) -
			  __builtin_clz((unsigned) size - 1) -
			  cache->order0_size_lb);
}